

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O0

int big_file_mpi_open(BigFile *bf,char *basename,MPI_Comm comm)

{
  char *pcVar1;
  int local_30;
  int local_2c;
  int rt;
  int rank;
  MPI_Comm comm_local;
  char *basename_local;
  BigFile *bf_local;
  
  if (comm == (MPI_Comm)&ompi_mpi_comm_null) {
    bf_local._4_4_ = 0;
  }
  else {
    _rt = comm;
    comm_local = (MPI_Comm)basename;
    basename_local = (char *)bf;
    MPI_Comm_rank(comm,&local_2c);
    if (local_2c == 0) {
      local_30 = big_file_open((BigFile *)basename_local,(char *)comm_local);
    }
    else {
      pcVar1 = _strdup((char *)comm_local);
      *(char **)basename_local = pcVar1;
      local_30 = 0;
    }
    bf_local._4_4_ = big_file_mpi_broadcast_anyerror(local_30,_rt);
  }
  return bf_local._4_4_;
}

Assistant:

int big_file_mpi_open(BigFile * bf, const char * basename, MPI_Comm comm) {
    if(comm == MPI_COMM_NULL) return 0;
    int rank;
    MPI_Comm_rank(comm, &rank);
    int rt = 0;
    if (rank == 0) {
        rt = big_file_open(bf, basename);
    } else {
        /* FIXME : */
        bf->basename = _strdup(basename);
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    return rt;
}